

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

int __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  DataChunk *result_00;
  uint input;
  CURSOR *pCVar1;
  bool bVar2;
  reference pvVar3;
  undefined1 auVar4 [12];
  int result_1;
  int local_44;
  string local_40;
  
  pCVar1 = accessor->data;
  if (((pCVar1->scan).next_row_index <= lidx) || (lidx < (pCVar1->scan).current_row_index)) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (int *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar1->validity = &pvVar3->validity;
  }
  input = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)];
  bVar2 = TryCast::Operation<int,int>(input,&local_44,false);
  if (bVar2) {
    return local_44;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)input,auVar4._8_4_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,&local_40);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}